

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O2

int Iso_ObjHashAdd(Iso_Man_t *p,Iso_Obj_t *pIso)

{
  uint Value;
  uint uVar1;
  int iVar2;
  Iso_Obj_t *pIVar3;
  long lVar4;
  int *piVar5;
  uint *pArray;
  Iso_Obj_t *local_40;
  Iso_Obj_t *local_38;
  
  uVar1 = 0;
  for (lVar4 = 0; lVar4 != 0xc; lVar4 = lVar4 + 4) {
    uVar1 = uVar1 ^ *(int *)(&pIso->field_0x0 + lVar4) *
                    *(int *)((long)If_CluHashKey::BigPrimes + lVar4);
  }
  p->nEntries = p->nEntries + 1;
  piVar5 = p->pBins + (int)(uVar1 % (uint)p->nBins);
  local_38 = pIso;
  while( true ) {
    pIVar3 = Iso_ManObj(p,*piVar5);
    local_40 = pIVar3;
    if (pIVar3 == (Iso_Obj_t *)0x0) {
      iVar2 = Iso_ObjId(p,pIso);
      *piVar5 = iVar2;
      p->nSingles = p->nSingles + 1;
      return iVar2;
    }
    iVar2 = Iso_ObjCompare(&local_40,&local_38);
    if (iVar2 == 0) break;
    piVar5 = &pIVar3->iNext;
  }
  iVar2 = pIVar3->iClass;
  if (iVar2 == 0) {
    p->nClasses = p->nClasses + 1;
    p->nSingles = p->nSingles + -1;
  }
  pIso->iClass = iVar2;
  iVar2 = Iso_ObjId(p,pIso);
  pIVar3->iClass = iVar2;
  return iVar2;
}

Assistant:

static inline int Iso_ObjHashAdd( Iso_Man_t * p, Iso_Obj_t * pIso )
{
    Iso_Obj_t * pThis;
    int * pPlace = p->pBins + Iso_ObjHash( pIso, p->nBins );
    p->nEntries++;
    for ( pThis = Iso_ManObj(p, *pPlace); 
          pThis; pPlace = &pThis->iNext, 
          pThis = Iso_ManObj(p, *pPlace) )
        if ( Iso_ObjCompare( &pThis, &pIso ) == 0 ) // equal signatures
        {
            if ( pThis->iClass == 0 )
            {
                p->nClasses++;
                p->nSingles--;
            }
            // add to the list
            pIso->iClass = pThis->iClass;
            pThis->iClass = Iso_ObjId( p, pIso );
            return 1;
        }
    // create new list
    *pPlace = Iso_ObjId( p, pIso );
    p->nSingles++;
    return 0;
}